

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5StorageDelete(Fts5Storage *p,i64 iDel,sqlite3_value **apVal,int bSaveRow)

{
  Fts5Config *pFVar1;
  Fts5Config *pConfig;
  Fts5Index *p_00;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  Fts5Storage *ap;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Mem *pMem;
  ulong uVar10;
  sqlite3_value *pVal;
  char *pText;
  uchar *puVar11;
  Fts5Structure *pStruct;
  Fts5Data *pPg;
  ulong uVar12;
  long lVar13;
  long lVar14;
  sqlite3_stmt *psVar15;
  ulong uVar16;
  long lVar17;
  Fts5StructureSegment *pFVar18;
  long in_FS_OFFSET;
  sqlite3_stmt *pDel;
  int nHash;
  sqlite3_stmt *local_78;
  int local_6c;
  uchar *local_68;
  int local_5c;
  char *local_58;
  Fts5Storage *local_50;
  undefined8 local_48;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar1 = p->pConfig;
  local_78 = (sqlite3_stmt *)0x0;
  uVar6 = fts5StorageLoadTotals(p,1);
  if ((uVar6 != 0) || (uVar6 = sqlite3Fts5IndexBeginWrite(p->pIndex,1,iDel), uVar6 != 0))
  goto LAB_001ecc6d;
  pConfig = p->pConfig;
  if (pConfig->bContentlessDelete == 0) {
    local_40 = (sqlite3_stmt *)0x0;
    local_48 = 0xaaaaaaaaffffffff;
    if (apVal == (sqlite3_value **)0x0) {
      psVar15 = p->pSavedRow;
      if (bSaveRow == 0 || psVar15 == (sqlite3_stmt *)0x0) {
        uVar6 = fts5StorageGetStmt(p,bSaveRow + 2,&local_40,(char **)0x0);
        psVar15 = local_40;
        if (uVar6 == 0) {
          sqlite3_bind_int64(local_40,1,iDel);
          iVar7 = sqlite3_step(psVar15);
          if (iVar7 == 100) goto LAB_001ecdd5;
LAB_001ed3ea:
          uVar6 = sqlite3_reset(psVar15);
        }
        goto LAB_001ed385;
      }
      p->pSavedRow = (sqlite3_stmt *)0x0;
    }
    else {
      psVar15 = (sqlite3_stmt *)0x0;
    }
LAB_001ecdd5:
    lVar17 = 1;
    local_50 = p;
    do {
      if (pConfig->nCol < lVar17) {
        if (p->nTotalRow < 1) {
          uVar6 = 0x10b;
          goto LAB_001ed37b;
        }
        p->nTotalRow = p->nTotalRow + -1;
        if (bSaveRow == 0) goto LAB_001ed3ea;
        p->pSavedRow = psVar15;
        uVar6 = 0;
        goto LAB_001ed385;
      }
      uVar6 = 0;
      if (pConfig->abUnindexed[lVar17 + -1] == '\0') {
        local_58 = (char *)0x0;
        local_5c = 0;
        local_68 = (uchar *)0x0;
        local_6c = 0;
        iVar7 = (int)lVar17;
        if (psVar15 == (sqlite3_stmt *)0x0) {
          pVal = apVal[lVar17 + -1];
        }
        else {
          pVal = sqlite3_column_value(psVar15,iVar7);
        }
        if ((pConfig->bLocale == 0) || (iVar8 = sqlite3Fts5IsLocaleValue(pConfig,pVal), iVar8 == 0))
        {
          pText = (char *)sqlite3ValueText(pVal,'\x01');
          iVar8 = sqlite3ValueBytes(pVal,'\x01');
          if ((psVar15 == (sqlite3_stmt *)0x0) || (pConfig->bLocale == 0)) {
            puVar11 = (uchar *)0x0;
            iVar7 = 0;
          }
          else {
            puVar11 = sqlite3_column_text(psVar15,pConfig->nCol + iVar7);
            iVar7 = sqlite3_column_bytes(psVar15,pConfig->nCol + iVar7);
          }
        }
        else {
          uVar6 = sqlite3Fts5DecodeLocaleValue
                            (pVal,&local_58,&local_5c,(char **)&local_68,&local_6c);
          pText = local_58;
          puVar11 = local_68;
          iVar7 = local_6c;
          iVar8 = local_5c;
          if (uVar6 != 0) goto LAB_001ecf91;
        }
        (pConfig->t).pLocale = (char *)puVar11;
        (pConfig->t).nLocale = iVar7;
        local_48 = local_48 & 0xffffffff;
        uVar9 = sqlite3Fts5Tokenize(pConfig,4,pText,iVar8,&local_50,fts5StorageInsertCallback);
        lVar13 = p->aTotalSize[lVar17 + -1] - (long)local_48._4_4_;
        p->aTotalSize[lVar17 + -1] = lVar13;
        uVar6 = (uint)(lVar13 >> 0x3f) & 0x10b;
        if (uVar9 != 0) {
          uVar6 = uVar9;
        }
        (pConfig->t).pLocale = (char *)0x0;
        (pConfig->t).nLocale = 0;
      }
LAB_001ecf91:
      lVar17 = lVar17 + 1;
    } while (uVar6 == 0);
    p->nTotalRow = p->nTotalRow + -1;
LAB_001ed37b:
    sqlite3_reset(psVar15);
    goto LAB_001ed385;
  }
  local_40 = (sqlite3_stmt *)0x0;
  uVar6 = fts5StorageGetStmt(p,9,&local_40,(char **)0x0);
  psVar15 = local_40;
  if (uVar6 != 0) goto LAB_001ecc6d;
  sqlite3_bind_int64(local_40,1,iDel);
  iVar7 = sqlite3_step(psVar15);
  if (iVar7 == 100) {
    pMem = columnMem(psVar15,1);
    uVar10 = sqlite3VdbeIntValue(pMem);
    columnMallocFailure(psVar15);
  }
  else {
    uVar10 = 0;
  }
  uVar6 = sqlite3_reset(psVar15);
  if (uVar10 != 0 && uVar6 == 0) {
    p_00 = p->pIndex;
    pStruct = fts5StructureRead(p_00);
    if (pStruct != (Fts5Structure *)0x0) {
      if (0 < (long)pStruct->nLevel) {
        bVar5 = false;
        lVar17 = (long)pStruct->nLevel;
        do {
          lVar13 = (long)pStruct->aLevel[lVar17 + -1].nSeg;
          if (0 < lVar13) {
            do {
              lVar14 = lVar13 + -1;
              pFVar18 = pStruct->aLevel[lVar17 + -1].aSeg;
              if ((pFVar18[lVar14].iOrigin1 <= uVar10) &&
                 (pFVar18 = pFVar18 + lVar14, uVar10 <= pFVar18->iOrigin2)) {
                if (!bVar5) {
                  pFVar18->nEntryTombstone = pFVar18->nEntryTombstone + 1;
                }
                local_58 = (char *)((ulong)local_58 & 0xffffffff00000000);
                local_50 = (Fts5Storage *)0x0;
                p_00->nContentlessDelete = p_00->nContentlessDelete + 1;
                if ((long)pFVar18->nPgTombstone < 1) {
                  fts5IndexTombstoneRebuild
                            (p_00,pFVar18,(Fts5Data *)0x0,-1,
                             (uint)((ulong)iDel >> 0x20 != 0) * 4 + 4,(int *)&local_58,
                             (Fts5Data ***)&local_50);
                  pPg = (Fts5Data *)0x0;
LAB_001ed1c4:
                  ap = local_50;
                  iVar7 = (int)local_58;
                  uVar12 = (ulong)(int)local_58;
                  if (uVar12 != 0) {
                    fts5IndexTombstoneAddToPage
                              ((Fts5Data *)local_50->aStmt[(ulong)iDel % uVar12 - 6],1,(int)local_58
                               ,iDel);
                    if (0 < iVar7) {
                      uVar16 = 0;
                      do {
                        psVar15 = ap->aStmt[uVar16 - 6];
                        fts5DataWrite(p_00,((ulong)(pFVar18->iSegid + 0x10000) << 0x25) + uVar16,
                                      *(u8 **)psVar15,*(int *)(psVar15 + 8));
                        uVar16 = uVar16 + 1;
                      } while (uVar12 != uVar16);
                    }
                    pFVar18->nPgTombstone = iVar7;
                    fts5StructureWrite(p_00,p_00->pStruct);
                  }
                  sqlite3_free(pPg);
                  fts5IndexFreeArray((Fts5Data **)ap,iVar7);
                }
                else {
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = (long)pFVar18->nPgTombstone;
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = iDel;
                  uVar12 = SUB168(auVar4 % auVar3,0);
                  pPg = fts5DataRead(p_00,(ulong)(pFVar18->iSegid + 0x10000) << 0x25 | uVar12);
                  if (pPg != (Fts5Data *)0x0) {
                    iVar7 = fts5IndexTombstoneAddToPage(pPg,0,pFVar18->nPgTombstone,iDel);
                    if (iVar7 != 0) {
                      iVar7 = (uint)(*pPg->p != '\x04') * 4 + 4;
                      if ((ulong)iDel >> 0x20 != 0) {
                        iVar7 = 8;
                      }
                      fts5IndexTombstoneRebuild
                                (p_00,pFVar18,pPg,SUB164(auVar4 % auVar3,0),iVar7,(int *)&local_58,
                                 (Fts5Data ***)&local_50);
                      goto LAB_001ed1c4;
                    }
                    fts5DataWrite(p_00,(ulong)(pFVar18->iSegid + 0x10000) << 0x25 | uVar12,pPg->p,
                                  pPg->nn);
                    sqlite3_free(pPg);
                  }
                }
                bVar5 = true;
              }
              bVar2 = 1 < lVar13;
              lVar13 = lVar14;
            } while (bVar2);
          }
          bVar2 = 1 < lVar17;
          lVar17 = lVar17 + -1;
        } while (bVar2);
      }
      fts5StructureRelease(pStruct);
    }
    uVar6 = p_00->rc;
    p_00->rc = 0;
  }
  if ((bSaveRow == 0) || (uVar6 != 0)) {
LAB_001ed385:
    if (uVar6 != 0) goto LAB_001ecc6d;
  }
  else if (p->pConfig->eContent == 3) {
    uVar6 = sqlite3Fts5StorageFindDeleteRow(p,iDel);
    goto LAB_001ed385;
  }
  if (pFVar1->bColumnsize == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = fts5StorageGetStmt(p,8,&local_78,(char **)0x0);
    psVar15 = local_78;
    if (uVar6 == 0) {
      sqlite3_bind_int64(local_78,1,iDel);
      sqlite3_step(psVar15);
      uVar6 = sqlite3_reset(psVar15);
    }
  }
LAB_001ecc6d:
  iVar7 = pFVar1->eContent;
  if ((((iVar7 == 3) || (iVar7 == 0)) && (uVar6 == 0)) &&
     (uVar6 = fts5StorageGetStmt(p,6,&local_78,(char **)0x0), psVar15 = local_78, uVar6 == 0)) {
    sqlite3_bind_int64(local_78,1,iDel);
    sqlite3_step(psVar15);
    uVar6 = sqlite3_reset(psVar15);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar6;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5StorageDelete(
  Fts5Storage *p,                 /* Storage object */
  i64 iDel,                       /* Rowid to delete from table */
  sqlite3_value **apVal,          /* Optional - values to remove from index */
  int bSaveRow                    /* If true, set pSavedRow for deleted row */
){
  Fts5Config *pConfig = p->pConfig;
  int rc;
  sqlite3_stmt *pDel = 0;

  assert( pConfig->eContent!=FTS5_CONTENT_NORMAL || apVal==0 );
  rc = fts5StorageLoadTotals(p, 1);

  /* Delete the index records */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexBeginWrite(p->pIndex, 1, iDel);
  }

  if( rc==SQLITE_OK ){
    if( p->pConfig->bContentlessDelete ){
      rc = fts5StorageContentlessDelete(p, iDel);
      if( rc==SQLITE_OK
       && bSaveRow
       && p->pConfig->eContent==FTS5_CONTENT_UNINDEXED
      ){
        rc = sqlite3Fts5StorageFindDeleteRow(p, iDel);
      }
    }else{
      rc = fts5StorageDeleteFromIndex(p, iDel, apVal, bSaveRow);
    }
  }

  /* Delete the %_docsize record */
  if( rc==SQLITE_OK && pConfig->bColumnsize ){
    rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_DOCSIZE, &pDel, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  /* Delete the %_content record */
  if( pConfig->eContent==FTS5_CONTENT_NORMAL
   || pConfig->eContent==FTS5_CONTENT_UNINDEXED
  ){
    if( rc==SQLITE_OK ){
      rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_CONTENT, &pDel, 0);
    }
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  return rc;
}